

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

FT_Error T1_Set_MM_Design(T1_Face face,FT_UInt num_coords,FT_Long *coords)

{
  PS_Blend pPVar1;
  long *plVar2;
  FT_Long *pFVar3;
  FT_Error FVar4;
  long lVar5;
  FT_Long FVar6;
  ulong uVar7;
  ulong uVar8;
  uint num_coords_00;
  ulong uVar9;
  FT_Fixed final_blends [16];
  
  pPVar1 = face->blend;
  if (pPVar1 == (PS_Blend)0x0) {
    FVar4 = 6;
  }
  else {
    num_coords_00 = pPVar1->num_axis;
    if (num_coords_00 < num_coords) {
      num_coords = num_coords_00;
    }
    for (uVar8 = 0; uVar8 < num_coords_00; uVar8 = uVar8 + 1) {
      plVar2 = pPVar1->design_map[uVar8].design_points;
      pFVar3 = pPVar1->design_map[uVar8].blend_points;
      if (uVar8 < num_coords) {
        lVar5 = coords[uVar8];
        uVar9 = (ulong)pPVar1->design_map[uVar8].num_points;
      }
      else {
        uVar9 = (ulong)pPVar1->design_map[uVar8].num_points;
        lVar5 = (plVar2[uVar9 - 1] - *plVar2) / 2;
      }
      for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        if (lVar5 == plVar2[uVar7]) {
          FVar6 = pFVar3[uVar7];
          goto LAB_0017129d;
        }
        if (lVar5 < plVar2[uVar7]) {
          if ((int)(uVar7 - 1) < 0) goto LAB_0017129a;
          uVar9 = uVar7 - 1 & 0xffffffff;
          FVar6 = FT_MulDiv(lVar5 - plVar2[uVar9],pFVar3[uVar7] - pFVar3[uVar9],
                            plVar2[uVar7] - plVar2[uVar9]);
          num_coords_00 = pPVar1->num_axis;
          goto LAB_0017129d;
        }
      }
      if (uVar9 == 0) {
LAB_0017129a:
        FVar6 = *pFVar3;
      }
      else {
        FVar6 = pFVar3[uVar9 - 1];
      }
LAB_0017129d:
      final_blends[uVar8] = FVar6;
    }
    FVar4 = t1_set_mm_blend(face,num_coords_00,final_blends);
    if (FVar4 == 0) {
      (face->root).face_flags =
           (ulong)((ulong)num_coords != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
      FVar4 = 0;
    }
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_MM_Design( T1_Face   face,
                    FT_UInt   num_coords,
                    FT_Long*  coords )
  {
    FT_Error  error;
    PS_Blend  blend = face->blend;
    FT_UInt   n, p;
    FT_Fixed  final_blends[T1_MAX_MM_DESIGNS];


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* compute the blend coordinates through the blend design map */

    for ( n = 0; n < blend->num_axis; n++ )
    {
      FT_Long       design;
      FT_Fixed      the_blend;
      PS_DesignMap  map     = blend->design_map + n;
      FT_Long*      designs = map->design_points;
      FT_Fixed*     blends  = map->blend_points;
      FT_Int        before  = -1, after = -1;


      /* use a default value if we don't have a coordinate */
      if ( n < num_coords )
        design = coords[n];
      else
        design = ( designs[map->num_points - 1] - designs[0] ) / 2;

      for ( p = 0; p < (FT_UInt)map->num_points; p++ )
      {
        FT_Long  p_design = designs[p];


        /* exact match? */
        if ( design == p_design )
        {
          the_blend = blends[p];
          goto Found;
        }

        if ( design < p_design )
        {
          after = (FT_Int)p;
          break;
        }

        before = (FT_Int)p;
      }

      /* now interpolate if necessary */
      if ( before < 0 )
        the_blend = blends[0];

      else if ( after < 0 )
        the_blend = blends[map->num_points - 1];

      else
        the_blend = FT_MulDiv( design         - designs[before],
                               blends [after] - blends [before],
                               designs[after] - designs[before] );

    Found:
      final_blends[n] = the_blend;
    }

    error = t1_set_mm_blend( face, blend->num_axis, final_blends );
    if ( error )
      return error;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

    return FT_Err_Ok;
  }